

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O3

void jinit_d_coef_controller(j_decompress_ptr cinfo,boolean need_full_buffer)

{
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var1;
  jpeg_d_coef_controller *pjVar2;
  long lVar3;
  long lVar4;
  jvirt_barray_ptr pjVar5;
  void *pvVar6;
  _func_int_j_decompress_ptr_JSAMPIMAGE **pp_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  JDIMENSION JVar9;
  int *piVar10;
  long lVar11;
  undefined1 auVar12 [16];
  
  pjVar2 = (jpeg_d_coef_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0xe8);
  cinfo->coef = pjVar2;
  pjVar2->start_input_pass = start_input_pass;
  pjVar2->start_output_pass = start_output_pass;
  pjVar2[5].decompress_data = (_func_int_j_decompress_ptr_JSAMPIMAGE *)0x0;
  if (need_full_buffer == 0) {
    pvVar6 = (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x500);
    lVar3 = 0;
    lVar4 = 1;
    lVar11 = 0;
    auVar12._8_4_ = (int)pvVar6;
    auVar12._0_8_ = pvVar6;
    auVar12._12_4_ = (int)((ulong)pvVar6 >> 0x20);
    do {
      (&pjVar2[1].start_output_pass)[lVar11] =
           (_func_void_j_decompress_ptr *)(lVar3 * 0x80 + (long)pvVar6);
      (&pjVar2[1].start_output_pass + lVar11)[1] =
           (_func_void_j_decompress_ptr *)(lVar4 * 0x80 + auVar12._8_8_);
      lVar11 = lVar11 + 2;
      lVar3 = lVar3 + 2;
      lVar4 = lVar4 + 2;
    } while (lVar11 != 10);
    pjVar2->consume_data = dummy_consume_data;
    pjVar2->decompress_data = decompress_onepass;
    pp_Var7 = (_func_int_j_decompress_ptr_JSAMPIMAGE **)0x0;
  }
  else {
    if (0 < cinfo->num_components) {
      piVar10 = &cinfo->comp_info->h_samp_factor;
      lVar11 = 0;
      do {
        JVar9 = piVar10[1] * 5;
        if (cinfo->progressive_mode == 0) {
          JVar9 = piVar10[1];
        }
        p_Var1 = cinfo->mem->request_virt_barray;
        lVar3 = jround_up((ulong)(uint)piVar10[5],(long)*piVar10);
        lVar4 = jround_up((ulong)(uint)piVar10[6],(long)piVar10[1]);
        pjVar5 = (*p_Var1)((j_common_ptr)cinfo,1,1,(JDIMENSION)lVar3,(JDIMENSION)lVar4,JVar9);
        (&pjVar2[3].decompress_data)[lVar11] = (_func_int_j_decompress_ptr_JSAMPIMAGE *)pjVar5;
        lVar11 = lVar11 + 1;
        piVar10 = piVar10 + 0x18;
      } while (lVar11 < cinfo->num_components);
    }
    pjVar2->consume_data = consume_data;
    pjVar2->decompress_data = decompress_data;
    pp_Var7 = &pjVar2[3].decompress_data;
  }
  pjVar2->coef_arrays = (jvirt_barray_ptr *)pp_Var7;
  p_Var8 = (_func_void_j_decompress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x80);
  pjVar2[3].start_output_pass = p_Var8;
  return;
}

Assistant:

GLOBAL(void)
jinit_d_coef_controller(j_decompress_ptr cinfo, boolean need_full_buffer)
{
  my_coef_ptr coef;

  coef = (my_coef_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_coef_controller));
  cinfo->coef = (struct jpeg_d_coef_controller *)coef;
  coef->pub.start_input_pass = start_input_pass;
  coef->pub.start_output_pass = start_output_pass;
#ifdef BLOCK_SMOOTHING_SUPPORTED
  coef->coef_bits_latch = NULL;
#endif

  /* Create the coefficient buffer. */
  if (need_full_buffer) {
#ifdef D_MULTISCAN_FILES_SUPPORTED
    /* Allocate a full-image virtual array for each component, */
    /* padded to a multiple of samp_factor DCT blocks in each direction. */
    /* Note we ask for a pre-zeroed array. */
    int ci, access_rows;
    jpeg_component_info *compptr;

    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
         ci++, compptr++) {
      access_rows = compptr->v_samp_factor;
#ifdef BLOCK_SMOOTHING_SUPPORTED
      /* If block smoothing could be used, need a bigger window */
      if (cinfo->progressive_mode)
        access_rows *= 5;
#endif
      coef->whole_image[ci] = (*cinfo->mem->request_virt_barray)
        ((j_common_ptr)cinfo, JPOOL_IMAGE, TRUE,
         (JDIMENSION)jround_up((long)compptr->width_in_blocks,
                               (long)compptr->h_samp_factor),
         (JDIMENSION)jround_up((long)compptr->height_in_blocks,
                               (long)compptr->v_samp_factor),
         (JDIMENSION)access_rows);
    }
    coef->pub.consume_data = consume_data;
    coef->pub.decompress_data = decompress_data;
    coef->pub.coef_arrays = coef->whole_image; /* link to virtual arrays */
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    /* We only need a single-MCU buffer. */
    JBLOCKROW buffer;
    int i;

    buffer = (JBLOCKROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  D_MAX_BLOCKS_IN_MCU * sizeof(JBLOCK));
    for (i = 0; i < D_MAX_BLOCKS_IN_MCU; i++) {
      coef->MCU_buffer[i] = buffer + i;
    }
    coef->pub.consume_data = dummy_consume_data;
    coef->pub.decompress_data = decompress_onepass;
    coef->pub.coef_arrays = NULL; /* flag for no virtual arrays */
  }

  /* Allocate the workspace buffer */
  coef->workspace = (JCOEF *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(JCOEF) * DCTSIZE2);
}